

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O1

StmNode * __thiscall Translator::visit(Translator *this,WhileNode *whileNode)

{
  int iVar1;
  Label *this_00;
  Label *this_01;
  Label *this_02;
  SEQ *this_03;
  LABEL *this_04;
  SEQ *this_05;
  CJUMP *this_06;
  undefined4 extraout_var;
  ExprNode *right;
  SEQ *this_07;
  LABEL *this_08;
  SEQ *this_09;
  undefined4 extraout_var_00;
  SEQ *this_10;
  JUMP *this_11;
  NAME *this_12;
  LABEL *this_13;
  char endlabelName [200];
  char startLabelName [200];
  char testlabelName [200];
  WhileNode *local_2a0;
  char local_298 [208];
  char local_1c8 [208];
  char local_f8 [200];
  
  local_2a0 = whileNode;
  sprintf(local_f8,"while_test_%p",&local_2a0);
  sprintf(local_298,"while_end_%p",&local_2a0);
  sprintf(local_1c8,"while_start_%p",&local_2a0);
  this_00 = (Label *)operator_new(0x10);
  Label::Label(this_00,local_f8);
  this_01 = (Label *)operator_new(0x10);
  Label::Label(this_01,local_1c8);
  this_02 = (Label *)operator_new(0x10);
  Label::Label(this_02,local_298);
  this_03 = (SEQ *)operator_new(0x20);
  this_04 = (LABEL *)operator_new(0x18);
  LABEL::LABEL(this_04,this_00);
  this_05 = (SEQ *)operator_new(0x20);
  this_06 = (CJUMP *)operator_new(0x30);
  iVar1 = (*(local_2a0->head->super_StmtNode).super_ASTNode._vptr_ASTNode[4])();
  right = (ExprNode *)operator_new(0x10);
  CONST::CONST((CONST *)right,0);
  CJUMP::CJUMP(this_06,4,(ExprNode *)CONCAT44(extraout_var,iVar1),right,this_01,this_02);
  this_07 = (SEQ *)operator_new(0x20);
  this_08 = (LABEL *)operator_new(0x18);
  LABEL::LABEL(this_08,this_01);
  this_09 = (SEQ *)operator_new(0x20);
  iVar1 = (*(local_2a0->body->super_ASTNode)._vptr_ASTNode[4])(local_2a0->body,this);
  this_10 = (SEQ *)operator_new(0x20);
  this_11 = (JUMP *)operator_new(0x20);
  this_12 = (NAME *)operator_new(0x18);
  NAME::NAME(this_12,this_00);
  JUMP::JUMP(this_11,(ExprNode *)this_12,(LabelList *)0x0);
  this_13 = (LABEL *)operator_new(0x18);
  LABEL::LABEL(this_13,this_02);
  SEQ::SEQ(this_10,(StmNode *)this_11,(StmNode *)this_13);
  SEQ::SEQ(this_09,(StmNode *)CONCAT44(extraout_var_00,iVar1),(StmNode *)this_10);
  SEQ::SEQ(this_07,(StmNode *)this_08,(StmNode *)this_09);
  SEQ::SEQ(this_05,(StmNode *)this_06,(StmNode *)this_07);
  SEQ::SEQ(this_03,(StmNode *)this_04,(StmNode *)this_05);
  return &this_03->super_StmNode;
}

Assistant:

StmNode *Translator::visit(WhileNode *whileNode) {
    char testlabelName[200];
    char startLabelName[200];
    char endlabelName[200];
    sprintf(testlabelName, "while_test_%p", &whileNode);
    sprintf(endlabelName, "while_end_%p", &whileNode);
    sprintf(startLabelName, "while_start_%p", &whileNode);
    Label *testLabel = new Label(testlabelName);
    Label *startLabel = new Label(startLabelName);
    Label *endLabel = new Label(endlabelName);

    return new SEQ(new LABEL(testLabel),
                   new SEQ(new CJUMP(NE, whileNode->getHead()->accept(this), new CONST(0), startLabel, endLabel),
                           new SEQ(new LABEL(startLabel),
                                   new SEQ(whileNode->getBody()->accept(this),
                                           new SEQ(new JUMP(new NAME(testLabel), nullptr),
                                                   new LABEL(endLabel))))));
}